

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint32_t len;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  bVar1 = GetVarint32(input,&local_14);
  if ((bVar1) && (uVar2 = (ulong)local_14, uVar2 <= input->size_)) {
    result->data_ = input->data_;
    result->size_ = uVar2;
    input->data_ = input->data_ + uVar2;
    input->size_ = input->size_ - uVar2;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}